

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O2

Field __thiscall
wasm::anon_unknown_24::HeapTypeGeneratorImpl::generateField
          (HeapTypeGeneratorImpl *this,Shareability share)

{
  bool bVar1;
  bool bVar2;
  Type TVar3;
  ulong uVar4;
  Field FVar5;
  
  bVar1 = Random::oneIn(this->rand,2);
  bVar2 = Random::oneIn(this->rand,6);
  if (bVar2) {
    bVar2 = Random::oneIn(this->rand,2);
    TVar3.id = 2;
    uVar4 = 2 - (ulong)bVar2;
  }
  else {
    TVar3 = generateSingleType(this,share);
    uVar4 = 0;
  }
  FVar5._8_8_ = (ulong)bVar1 << 0x20 | uVar4;
  FVar5.type.id = TVar3.id;
  return FVar5;
}

Assistant:

Field generateField(Shareability share) {
    auto mutability = rand.oneIn(2) ? Mutable : Immutable;
    if (rand.oneIn(6)) {
      return {rand.oneIn(2) ? Field::i8 : Field::i16, mutability};
    } else {
      return {generateSingleType(share), mutability};
    }
  }